

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mac_legacy_kmgmt.c
# Opt level: O0

void * mac_gen_init_common(void *provctx,int selection)

{
  int iVar1;
  OSSL_LIB_CTX *pOVar2;
  undefined4 in_ESI;
  PROV_CTX *in_RDI;
  mac_gen_ctx *gctx;
  OSSL_LIB_CTX *libctx;
  undefined4 in_stack_ffffffffffffffe8;
  undefined8 *local_8;
  
  pOVar2 = ossl_prov_ctx_get0_libctx(in_RDI);
  iVar1 = ossl_prov_is_running();
  if (iVar1 == 0) {
    local_8 = (undefined8 *)0x0;
  }
  else {
    local_8 = (undefined8 *)
              CRYPTO_zalloc((size_t)in_RDI,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                            (int)((ulong)pOVar2 >> 0x20));
    if (local_8 != (undefined8 *)0x0) {
      *local_8 = pOVar2;
      *(undefined4 *)(local_8 + 1) = in_ESI;
    }
  }
  return local_8;
}

Assistant:

static void *mac_gen_init_common(void *provctx, int selection)
{
    OSSL_LIB_CTX *libctx = PROV_LIBCTX_OF(provctx);
    struct mac_gen_ctx *gctx = NULL;

    if (!ossl_prov_is_running())
        return NULL;

    if ((gctx = OPENSSL_zalloc(sizeof(*gctx))) != NULL) {
        gctx->libctx = libctx;
        gctx->selection = selection;
    }
    return gctx;
}